

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

string * google::protobuf::compiler::anon_unknown_0::MapEntryName
                   (string *__return_storage_ptr__,string *field_name)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  char cVar4;
  undefined4 local_34;
  int i;
  bool cap_next;
  string *field_name_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  bVar1 = true;
  for (local_34 = 0; uVar2 = std::__cxx11::string::size(), (ulong)(long)local_34 < uVar2;
      local_34 = local_34 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)field_name);
    if (*pcVar3 == '_') {
      bVar1 = true;
    }
    else {
      cVar4 = (char)__return_storage_ptr__;
      if (bVar1) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)field_name);
        if ((*pcVar3 < 'a') ||
           (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)field_name), 'z' < *pcVar3)) {
          std::__cxx11::string::operator[]((ulong)field_name);
          std::__cxx11::string::push_back(cVar4);
        }
        else {
          std::__cxx11::string::operator[]((ulong)field_name);
          std::__cxx11::string::push_back(cVar4);
        }
        bVar1 = false;
      }
      else {
        std::__cxx11::string::operator[]((ulong)field_name);
        std::__cxx11::string::push_back(cVar4);
      }
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string MapEntryName(const string& field_name) {
  string result;
  static const char kSuffix[] = "Entry";
  result.reserve(field_name.size() + sizeof(kSuffix));
  bool cap_next = true;
  for (int i = 0; i < field_name.size(); ++i) {
    if (field_name[i] == '_') {
      cap_next = true;
    } else if (cap_next) {
      // Note: Do not use ctype.h due to locales.
      if ('a' <= field_name[i] && field_name[i] <= 'z') {
        result.push_back(field_name[i] - 'a' + 'A');
      } else {
        result.push_back(field_name[i]);
      }
      cap_next = false;
    } else {
      result.push_back(field_name[i]);
    }
  }
  result.append(kSuffix);
  return result;
}